

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

void mergesort_lcp_2way_unstable(uchar **strings,size_t n)

{
  size_t __size;
  MergeResult MVar1;
  lcp_t *lcp_input;
  lcp_t *lcp_output;
  uchar **strings_output;
  
  __size = n * 8;
  lcp_input = (lcp_t *)malloc(__size);
  lcp_output = (lcp_t *)malloc(__size);
  strings_output = (uchar **)malloc(__size);
  MVar1 = mergesort_lcp_2way_unstable<false>(strings,strings_output,lcp_input,lcp_output,n);
  if (MVar1 == SortedInTemp) {
    memcpy(strings,strings_output,__size);
  }
  free(lcp_input);
  free(lcp_output);
  free(strings_output);
  return;
}

Assistant:

void
mergesort_lcp_2way_unstable(unsigned char** strings, size_t n)
{
	lcp_t* lcp_input  = static_cast<lcp_t*>(malloc(n*sizeof(lcp_t)));
	lcp_t* lcp_output = static_cast<lcp_t*>(malloc(n*sizeof(lcp_t)));
	unsigned char** tmp = static_cast<unsigned char**>(
			malloc(n*sizeof(unsigned char*)));
	const MergeResult m = mergesort_lcp_2way_unstable<false>(strings, tmp,
			lcp_input, lcp_output, n);
	if (m == SortedInTemp) {
		(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
	}
	free(lcp_input);
	free(lcp_output);
	free(tmp);
}